

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::is_msl_resource_binding_used
          (CompilerMSL *this,ExecutionModel model,uint32_t desc_set,uint32_t binding)

{
  undefined1 uVar1;
  const_iterator cVar2;
  StageSetBinding tuple;
  key_type local_c;
  
  local_c.model = model;
  local_c.desc_set = desc_set;
  local_c.binding = binding;
  cVar2 = ::std::
          _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->resource_bindings)._M_h,&local_c);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(undefined1 *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                    ._M_cur + 0x34);
  }
  return (bool)uVar1;
}

Assistant:

bool CompilerMSL::is_msl_resource_binding_used(ExecutionModel model, uint32_t desc_set, uint32_t binding) const
{
	StageSetBinding tuple = { model, desc_set, binding };
	auto itr = resource_bindings.find(tuple);
	return itr != end(resource_bindings) && itr->second.second;
}